

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpcommon.c
# Opt level: O0

sftp_packet * sftp_pkt_init(int type)

{
  sftp_packet *psVar1;
  sftp_packet *pkt;
  int type_local;
  
  psVar1 = (sftp_packet *)safemalloc(1,0x68,0);
  psVar1->data = (char *)0x0;
  psVar1->savedpos = 0xffffffffffffffff;
  psVar1->length = 0;
  psVar1->maxlen = 0;
  psVar1->type = type;
  psVar1->binarysink_[0].write = sftp_pkt_BinarySink_write;
  psVar1->binarysink_[0].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
  psVar1->binarysink_[0].binarysink_ = psVar1->binarysink_;
  BinarySink_put_uint32(psVar1->binarysink_,0);
  BinarySink_put_byte(psVar1->binarysink_,'\0');
  return psVar1;
}

Assistant:

struct sftp_packet *sftp_pkt_init(int type)
{
    struct sftp_packet *pkt;
    pkt = snew(struct sftp_packet);
    pkt->data = NULL;
    pkt->savedpos = -1;
    pkt->length = 0;
    pkt->maxlen = 0;
    pkt->type = type;
    BinarySink_INIT(pkt, sftp_pkt_BinarySink_write);
    put_uint32(pkt, 0); /* length field will be filled in later */
    put_byte(pkt, 0); /* so will the type field */
    return pkt;
}